

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_common.c
# Opt level: O2

lzma_ret lzma_delta_coder_init
                   (lzma_next_coder_conflict *next,lzma_allocator *allocator,
                   lzma_filter_info *filters)

{
  void *options;
  lzma_ret lVar1;
  lzma_coder_conflict *plVar2;
  uint64_t uVar3;
  
  plVar2 = next->coder;
  if (plVar2 == (lzma_coder_conflict *)0x0) {
    plVar2 = (lzma_coder_conflict *)lzma_alloc(0x150,allocator);
    next->coder = plVar2;
    if (plVar2 == (lzma_coder_conflict *)0x0) {
      return LZMA_MEM_ERROR;
    }
    next->end = delta_coder_end;
    (plVar2->next).memconfig =
         (_func_lzma_ret_lzma_coder_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t_conflict *)0x0;
    (plVar2->next).update =
         (_func_lzma_ret_lzma_coder_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr_conflict
          *)0x0;
    (plVar2->next).end = (lzma_end_function_conflict)0x0;
    (plVar2->next).get_check = (_func_lzma_check_lzma_coder_ptr_conflict *)0x0;
    (plVar2->next).init = 0;
    (plVar2->next).code = (lzma_code_function_conflict)0x0;
    (plVar2->next).coder = (lzma_coder_conflict *)0x0;
    (plVar2->next).id = 0xffffffffffffffff;
  }
  options = filters->options;
  uVar3 = lzma_delta_coder_memusage(options);
  if (uVar3 == 0xffffffffffffffff) {
    return LZMA_OPTIONS_ERROR;
  }
  *(ulong *)&plVar2->sequence = (ulong)*(uint *)((long)options + 4);
  memset(&plVar2->header_pos,0,0x101);
  lVar1 = lzma_next_filter_init((lzma_next_coder *)next->coder,allocator,filters + 1);
  return lVar1;
}

Assistant:

extern lzma_ret
lzma_delta_coder_init(lzma_next_coder *next, lzma_allocator *allocator,
		const lzma_filter_info *filters)
{
	const lzma_options_delta *opt;

	// Allocate memory for the decoder if needed.
	if (next->coder == NULL) {
		next->coder = lzma_alloc(sizeof(lzma_coder), allocator);
		if (next->coder == NULL)
			return LZMA_MEM_ERROR;

		// End function is the same for encoder and decoder.
		next->end = &delta_coder_end;
		next->coder->next = LZMA_NEXT_CODER_INIT;
	}

	// Validate the options.
	if (lzma_delta_coder_memusage(filters[0].options) == UINT64_MAX)
		return LZMA_OPTIONS_ERROR;

	// Set the delta distance.
	opt = filters[0].options;
	next->coder->distance = opt->dist;

	// Initialize the rest of the variables.
	next->coder->pos = 0;
	memzero(next->coder->history, LZMA_DELTA_DIST_MAX);

	// Initialize the next decoder in the chain, if any.
	return lzma_next_filter_init(&next->coder->next,
			allocator, filters + 1);
}